

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O2

void h264_print_ref_pic_list_modification(h264_ref_pic_list_modification *list,char *which)

{
  h264_slice_ref_pic_list_modification_entry *phVar1;
  long lVar2;
  
  printf("\tref_pic_list_modification_flag_%s = %d\n",which,(ulong)list->flag);
  phVar1 = list->list;
  while( true ) {
    lVar2 = (long)(int)phVar1->op;
    if (lVar2 == 3) break;
    printf("\tmodification_of_pic_nums_idc = %d [%s]\n",(ulong)phVar1->op,
           h264_print_ref_pic_list_modification_opnames_rel +
           *(int *)(h264_print_ref_pic_list_modification_opnames_rel + lVar2 * 4));
    printf("\t%s = %d\n",h264_print_ref_pic_list_modification::argnames[lVar2],(ulong)phVar1->op);
    phVar1 = phVar1 + 1;
  }
  puts("\tmodification_of_pic_nums_idc = 3 [END]");
  return;
}

Assistant:

void h264_print_ref_pic_list_modification(struct h264_ref_pic_list_modification *list, char *which) {
	static const char *const opnames[6] = { "pic_num sub", "pic_num add", "long term", "end", "view idx sub", "view idx add" };
	static const char *const argnames[6] = { "abs_diff_pic_num_minus1", "abs_diff_pic_num_minus1", "long_term_pic_num", 0, "abs_diff_view_idx_minus1", "abs_diff_view_idx_minus1" };
	int i;
	printf("\tref_pic_list_modification_flag_%s = %d\n", which, list->flag);
	for (i = 0; list->list[i].op != 3; i++) {
		int op = list->list[i].op;
		printf("\tmodification_of_pic_nums_idc = %d [%s]\n", op, opnames[op]);
		printf("\t%s = %d\n", argnames[op], list->list[i].op);
	}
	printf("\tmodification_of_pic_nums_idc = 3 [END]\n");
}